

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_io.c
# Opt level: O0

int cfg_io_save(cfg_instance *instance,char *url,cfg_db *src,autobuf *log)

{
  char *local_40;
  char *io_param;
  cfg_io *io;
  autobuf *log_local;
  cfg_db *src_local;
  char *url_local;
  cfg_instance *instance_local;
  
  local_40 = (char *)0x0;
  io = (cfg_io *)log;
  log_local = (autobuf *)src;
  src_local = (cfg_db *)url;
  url_local = (char *)instance;
  io_param = (char *)_find_io(instance,url,&local_40,log);
  if ((cfg_io *)io_param == (cfg_io *)0x0) {
    cfg_append_printable_line((autobuf *)io,"Error, unknown config io \'%s\'.",src_local);
    instance_local._4_4_ = -1;
  }
  else if (((cfg_io *)io_param)->save == (_func_int_char_ptr_cfg_db_ptr_autobuf_ptr *)0x0) {
    cfg_append_printable_line
              ((autobuf *)io,"Error, config io \'%s\' does not support saving.",
               ((cfg_io *)io_param)->name);
    instance_local._4_4_ = -1;
  }
  else {
    instance_local._4_4_ = (*((cfg_io *)io_param)->save)(local_40,(cfg_db *)log_local,(autobuf *)io)
    ;
  }
  return instance_local._4_4_;
}

Assistant:

int
cfg_io_save(struct cfg_instance *instance, const char *url, struct cfg_db *src, struct autobuf *log) {
  struct cfg_io *io;
  const char *io_param = NULL;

  io = _find_io(instance, url, &io_param, log);
  if (io == NULL) {
    cfg_append_printable_line(log, "Error, unknown config io '%s'.", url);
    return -1;
  }

  if (io->save == NULL) {
    cfg_append_printable_line(log, "Error, config io '%s' does not support saving.", io->name);
    return -1;
  }
  return io->save(io_param, src, log);
}